

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O0

psize p_list_length(PList *list)

{
  PList *local_28;
  psize ret;
  PList *cur;
  PList *list_local;
  
  if (list == (PList *)0x0) {
    list_local = (PList *)0x0;
  }
  else {
    local_28 = (PList *)0x1;
    for (ret = (psize)list; *(long *)(ret + 8) != 0; ret = *(psize *)(ret + 8)) {
      local_28 = (PList *)((long)&local_28->data + 1);
    }
    list_local = local_28;
  }
  return (psize)list_local;
}

Assistant:

P_LIB_API psize
p_list_length (const PList *list)
{
	const PList	*cur;
	psize		ret;

	if (P_UNLIKELY (list == NULL))
		return 0;

	for (cur = list, ret = 1; cur->next != NULL; cur = cur->next, ++ret)
		;

	return ret;
}